

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int sprint_dns_questions(char *dest,char *message_start)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  question q;
  
  read_dns_questions(&q,message_start);
  builtin_strncpy(dest,"-------QUESTIONS----------\n",0x1c);
  pcVar2 = debugstr(0xe,(uint)q.qtype);
  pcVar3 = "Unknow";
  if (q.qclass == 1) {
    pcVar3 = "IN";
  }
  iVar1 = sprintf(dest + 0x1b,"%s type:%s class:%s\n",&q,pcVar2,pcVar3);
  return (iVar1 + (int)(dest + 0x1b)) - (int)dest;
}

Assistant:

int sprint_dns_questions(char *dest, char *message_start) {
  struct question q;
  char *dest_ = dest;
  read_dns_questions(&q, message_start);
  dest += sprintf(dest, "-------QUESTIONS----------\n");
  dest += sprintf(dest, "%s type:%s class:%s\n", q.label,
                  debugstr(DEBUG_PRINT_TYPE_type, q.qtype),
                  debugstr(DEBUG_PRINT_TYPE_class, q.qclass));
  return dest - dest_;
}